

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

int JS_ReadFunctionBytecode
              (BCReaderState *s,JSFunctionBytecode *b,int byte_code_offset,uint32_t bc_len)

{
  int iVar1;
  uint idx_00;
  uint uVar2;
  BCReaderState *s_00;
  uint in_ECX;
  int in_EDX;
  long in_RSI;
  long in_RDI;
  uint32_t idx;
  JSAtom atom;
  int op;
  int len;
  int pos;
  uint8_t *bc_buf;
  uint32_t in_stack_ffffffffffffffbc;
  uint uVar3;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  uint32_t in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  uint uVar4;
  
  if ((*(int *)(in_RDI + 0x34) << 8) >> 0x18 == 0) {
    s_00 = (BCReaderState *)(in_RSI + in_EDX);
    iVar1 = bc_get_buf((BCReaderState *)
                       CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                       (uint8_t *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                       in_stack_ffffffffffffffbc);
    if (iVar1 != 0) {
      return -1;
    }
  }
  else {
    if (*(long *)(in_RDI + 0x18) - *(long *)(in_RDI + 0x10) < (long)(ulong)in_ECX) {
      iVar1 = bc_read_error_end((BCReaderState *)
                                CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
      return iVar1;
    }
    s_00 = *(BCReaderState **)(in_RDI + 0x10);
    *(ulong *)(in_RDI + 0x10) = *(long *)(in_RDI + 0x10) + (ulong)in_ECX;
  }
  *(BCReaderState **)(in_RSI + 0x20) = s_00;
  uVar4 = 0;
  do {
    if (in_ECX <= uVar4) {
      return 0;
    }
    idx_00 = (uint)*(byte *)((long)&s_00->ctx + (long)(int)uVar4);
    uVar3 = idx_00;
    if (0xb1 < idx_00) {
      uVar3 = idx_00 + 0xf;
    }
    uVar2 = (uint)opcode_info[(int)uVar3].size;
    uVar3 = idx_00;
    if (0xb1 < idx_00) {
      uVar3 = idx_00 + 0xf;
    }
    if (opcode_info[(int)uVar3].fmt - 0x17 < 5) {
      get_u32((uint8_t *)((long)&s_00->ctx + (long)(int)uVar4 + 1));
      if ((*(int *)(in_RDI + 0x34) << 8) >> 0x18 == 0) {
        iVar1 = bc_idx_to_atom(s_00,(JSAtom *)CONCAT44(uVar4,uVar2),idx_00);
        if (iVar1 != 0) {
          *(uint *)(in_RSI + 0x28) = uVar4;
          return -1;
        }
        put_u32((uint8_t *)((long)&s_00->ctx + (long)(int)uVar4 + 1),in_stack_ffffffffffffffc8);
      }
      else {
        JS_DupAtom((JSContext *)CONCAT44(uVar4,uVar2),idx_00);
      }
    }
    uVar4 = uVar2 + uVar4;
  } while( true );
}

Assistant:

static int JS_ReadFunctionBytecode(BCReaderState *s, JSFunctionBytecode *b,
                                   int byte_code_offset, uint32_t bc_len)
{
    uint8_t *bc_buf;
    int pos, len, op;
    JSAtom atom;
    uint32_t idx;

    if (s->is_rom_data) {
        /* directly use the input buffer */
        if (unlikely(s->buf_end - s->ptr < bc_len))
            return bc_read_error_end(s);
        bc_buf = (uint8_t *)s->ptr;
        s->ptr += bc_len;
    } else {
        bc_buf = (void *)((uint8_t*)b + byte_code_offset);
        if (bc_get_buf(s, bc_buf, bc_len))
            return -1;
    }
    b->byte_code_buf = bc_buf;

    pos = 0;
    while (pos < bc_len) {
        op = bc_buf[pos];
        len = short_opcode_info(op).size;
        switch(short_opcode_info(op).fmt) {
        case OP_FMT_atom:
        case OP_FMT_atom_u8:
        case OP_FMT_atom_u16:
        case OP_FMT_atom_label_u8:
        case OP_FMT_atom_label_u16:
            idx = get_u32(bc_buf + pos + 1);
            if (s->is_rom_data) {
                /* just increment the reference count of the atom */
                JS_DupAtom(s->ctx, (JSAtom)idx);
            } else {
                if (bc_idx_to_atom(s, &atom, idx)) {
                    /* Note: the atoms will be freed up to this position */
                    b->byte_code_len = pos;
                    return -1;
                }
                put_u32(bc_buf + pos + 1, atom);
#ifdef DUMP_READ_OBJECT
                bc_read_trace(s, "at %d, fixup atom: ", pos + 1); print_atom(s->ctx, atom); printf("\n");
#endif
            }
            break;
        default:
            break;
        }
        pos += len;
    }
    return 0;
}